

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  pointer *ppbVar1;
  size_t *psVar2;
  cmOSXBundleGenerator *pcVar3;
  cmLocalCommonGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  TargetType targetType_00;
  TargetType TVar8;
  int linkRuleLength;
  cmGeneratorTarget *this_00;
  string *psVar9;
  cmGeneratedFileStream *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  cmMakefile *this_01;
  cmGeneratorTarget *pcVar13;
  mapped_type *pmVar14;
  mapped_type *flags;
  mapped_type *linkFlags;
  cmMakefile *pcVar15;
  ulong uVar16;
  cmLocalNinjaGenerator *pcVar17;
  cmGlobalNinjaGenerator *pcVar18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  reference cc;
  reference pbVar19;
  reference pbVar20;
  bool local_1a15;
  string local_1610;
  string local_15f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15c8;
  allocator local_15a9;
  string local_15a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1588;
  allocator local_1561;
  key_type local_1560;
  allocator local_1539;
  key_type local_1538;
  undefined1 local_1518 [8];
  string soName;
  cmNinjaDeps symlinks;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1499;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1498;
  allocator local_1479;
  string local_1478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458;
  string local_1438;
  string local_1418;
  bool local_13f1;
  iterator iStack_13f0;
  bool usedResponseFile;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13e8;
  const_iterator oe;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13d8;
  const_iterator oi;
  key_type local_13c8;
  undefined1 local_13a8 [8];
  cmNinjaDeps orderOnlyDeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1368;
  undefined1 local_1348 [8];
  string rspfile;
  allocator local_1301;
  string local_1300;
  char *local_12e0;
  char *forceRspFile;
  cmGlobalNinjaGenerator *pcStack_12d0;
  int commandLineLengthLimit;
  cmGlobalNinjaGenerator *globalGen;
  key_type local_12c0;
  allocator local_1299;
  key_type local_1298;
  allocator local_1271;
  key_type local_1270;
  undefined1 local_1250 [8];
  cmNinjaVars symlinkVars;
  string postBuildCmdLine;
  key_type local_11f8;
  string local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  allocator local_1191;
  string local_1190;
  undefined1 local_1170 [8];
  string homeOutDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1148;
  iterator i_1;
  cmGeneratedFileStream fout;
  string local_ef0;
  string local_ed0;
  string local_eb0 [8];
  string obj_list_file;
  cmNinjaDeps objs;
  string local_e70;
  string local_e50;
  undefined1 local_e30 [8];
  string cmd;
  undefined1 local_df0 [8];
  string name_of_def_file_1;
  string cmakeCommand;
  string local_da8;
  byte local_d83;
  byte local_d82;
  allocator local_d81;
  string local_d80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d60;
  cmGlobalNinjaGenerator *local_d58;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccByproducts;
  cmCustomCommandGenerator ccg;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_cc8;
  const_iterator ci;
  pointer *ppbStack_cb8;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  undefined1 local_c98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  allocator local_c31;
  key_type local_c30;
  mapped_type *local_c10;
  string *link_path;
  char *local_c00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf8;
  allocator local_be9;
  key_type local_be8;
  mapped_type *local_bc8;
  string *linkLibraries;
  key_type local_bb8;
  string local_b98;
  string local_b78;
  undefined1 local_b58 [8];
  string objPath;
  key_type local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  allocator local_ac9;
  string local_ac8;
  allocator local_aa1;
  string local_aa0;
  allocator local_a79;
  undefined1 local_a78 [8];
  string dbg_suffix;
  string local_a50;
  undefined1 local_a30 [8];
  string suffix;
  string base;
  string prefix;
  key_type local_9c8;
  undefined1 local_9a8 [8];
  string impLibPath;
  cmNinjaDeps byproducts;
  key_type local_968;
  string local_948;
  undefined1 local_928 [8];
  string install_dir;
  key_type local_900;
  allocator local_8d9;
  key_type local_8d8;
  allocator local_8b1;
  key_type local_8b0;
  allocator local_889;
  key_type local_888;
  allocator local_861;
  key_type local_860;
  undefined1 local_840 [8];
  string t_1;
  key_type local_818;
  allocator local_7f1;
  key_type local_7f0;
  undefined1 local_7d0 [8];
  string t;
  key_type local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  allocator local_761;
  key_type local_760;
  string local_740;
  allocator local_719;
  key_type local_718;
  allocator local_6f1;
  key_type local_6f0;
  string local_6d0;
  allocator local_6a9;
  key_type local_6a8;
  allocator local_681;
  string local_680;
  allocator local_659;
  key_type local_658;
  allocator local_631;
  string local_630;
  string local_610;
  allocator local_5e9;
  key_type local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  undefined1 local_5a8 [8];
  string name_of_def_file;
  string local_580;
  allocator local_559;
  string local_558;
  allocator local_531;
  key_type local_530;
  allocator local_509;
  key_type local_508;
  allocator local_4e1;
  key_type local_4e0;
  allocator local_4b9;
  key_type local_4b8;
  string local_498;
  cmLocalNinjaGenerator *local_478;
  cmLocalNinjaGenerator *localGen;
  byte local_449;
  undefined1 local_448 [7];
  bool useWatcomQuote;
  string createRule;
  cmGeneratorTarget *genTarget;
  string linkPath;
  string frameworkPath;
  cmMakefile *mf;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  cmNinjaDeps outputs;
  ostringstream comment;
  undefined1 local_218 [8];
  cmNinjaVars vars;
  cmNinjaDeps emptyDeps;
  undefined1 local_1a8 [4];
  TargetType targetType;
  string local_188;
  string local_168;
  string local_148;
  undefined1 local_128 [8];
  string outpath;
  undefined1 local_e8 [8];
  string targetOutputImplib;
  undefined1 local_a8 [8];
  string targetOutputReal;
  string local_78;
  undefined1 local_58 [8];
  string targetOutput;
  string cfgName;
  cmGeneratorTarget *gt;
  cmNinjaNormalTargetGenerator *this_local;
  
  this_00 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string((string *)(targetOutput.field_2._M_local_buf + 8),(string *)psVar9);
  cmGeneratorTarget::GetFullPath
            (&local_78,this_00,(string *)(targetOutput.field_2._M_local_buf + 8),false,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_58,&this->super_cmNinjaTargetGenerator,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cmGeneratorTarget::GetFullPath
            ((string *)((long)&targetOutputImplib.field_2 + 8),this_00,
             (string *)((long)&targetOutput.field_2 + 8),false,true);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_a8,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&targetOutputImplib.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetOutputImplib.field_2._M_local_buf + 8));
  cmGeneratorTarget::GetFullPath
            ((string *)((long)&outpath.field_2 + 8),this_00,
             (string *)((long)&targetOutput.field_2 + 8),true,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)local_e8,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&outpath.field_2 + 8));
  std::__cxx11::string::~string((string *)(outpath.field_2._M_local_buf + 8));
  bVar5 = cmGeneratorTarget::IsAppBundleOnApple(this_00);
  if (bVar5) {
    cmGeneratorTarget::GetDirectory
              ((string *)local_128,this_00,(string *)((long)&targetOutput.field_2 + 8),false);
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&this->TargetNameOut,
               (string *)local_128);
    std::__cxx11::string::operator=((string *)local_58,(string *)local_128);
    std::__cxx11::string::operator+=((string *)local_58,"/");
    std::__cxx11::string::operator+=((string *)local_58,(string *)&this->TargetNameOut);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              (&local_148,&this->super_cmNinjaTargetGenerator,(string *)local_58);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::operator=((string *)local_a8,(string *)local_128);
    std::__cxx11::string::operator+=((string *)local_a8,"/");
    std::__cxx11::string::operator+=((string *)local_a8,(string *)&this->TargetNameReal);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              (&local_168,&this->super_cmNinjaTargetGenerator,(string *)local_a8);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_128);
  }
  else {
    bVar5 = cmGeneratorTarget::IsFrameworkOnApple(this_00);
    if (bVar5) {
      pcVar3 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory
                (&local_188,this_00,(string *)((long)&targetOutput.field_2 + 8),false);
      cmOSXBundleGenerator::CreateFramework(pcVar3,&this->TargetNameOut,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
    else {
      bVar5 = cmGeneratorTarget::IsCFBundleOnApple(this_00);
      if (bVar5) {
        pcVar3 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
        cmGeneratorTarget::GetDirectory
                  ((string *)local_1a8,this_00,(string *)((long)&targetOutput.field_2 + 8),false);
        cmOSXBundleGenerator::CreateCFBundle(pcVar3,&this->TargetNameOut,(string *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
      }
    }
  }
  pcVar10 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar10);
  targetType_00 = cmGeneratorTarget::GetType(this_00);
  pcVar10 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  poVar11 = std::operator<<((ostream *)pcVar10,"# Link build statements for ");
  pcVar12 = cmState::GetTargetTypeName(targetType_00);
  poVar11 = std::operator<<(poVar11,pcVar12);
  poVar11 = std::operator<<(poVar11," target ");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)
             &emptyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_cmNinjaTargetGenerator
            );
  poVar11 = std::operator<<(poVar11,(string *)
                                    &emptyDeps.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar11,"\n\n");
  std::__cxx11::string::~string
            ((string *)
             &emptyDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_218);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar11 = std::operator<<((ostream *)
                            &outputs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"Link the ");
  pcVar12 = GetVisibleTypeName(this);
  poVar11 = std::operator<<(poVar11,pcVar12);
  poVar11 = std::operator<<(poVar11," ");
  std::operator<<(poVar11,(string *)local_a8);
  ppbVar1 = &explicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppbVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ppbVar1,(value_type *)local_a8);
  cmNinjaTargetGenerator::GetObjects_abi_cxx11_
            ((cmNinjaDeps *)
             &implicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_cmNinjaTargetGenerator
            );
  cmNinjaTargetGenerator::ComputeLinkDeps_abi_cxx11_
            ((cmNinjaDeps *)&mf,&this->super_cmNinjaTargetGenerator);
  this_01 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&genTarget);
  pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  createRule.field_2._8_8_ = pcVar13;
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)local_448,pcVar13,&this->TargetLinkLanguage,psVar9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&localGen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                 "_USE_WATCOM_QUOTE");
  bVar5 = cmMakefile::IsOn(this_01,(string *)&localGen);
  std::__cxx11::string::~string((string *)&localGen);
  local_449 = bVar5;
  local_478 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmOutputConverter::ConvertToOutputFormat
            (&local_498,
             &(local_478->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,(string *)local_a8,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"TARGET_FILE",&local_4b9);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_4b8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::__cxx11::string::~string((string *)&local_498);
  pcVar17 = local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"LINK_LIBRARIES",&local_4e1);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"FLAGS",&local_509);
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_218,&local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_530,"LINK_FLAGS",&local_531);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_530);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)pcVar17,pmVar14,flags,linkFlags,
             (string *)((long)&linkPath.field_2 + 8),(string *)&genTarget,
             (cmGeneratorTarget *)createRule.field_2._8_8_,(bool)(local_449 & 1));
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  pcVar15 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_558,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS",&local_559);
  bVar6 = cmMakefile::IsOn(pcVar15,&local_558);
  bVar5 = false;
  if (bVar6) {
    TVar8 = cmGeneratorTarget::GetType(this_00);
    bVar5 = TVar8 == SHARED_LIBRARY;
  }
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_580,"WINDOWS_EXPORT_ALL_SYMBOLS",
               (allocator *)(name_of_def_file.field_2._M_local_buf + 0xf));
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator
              ((allocator<char> *)(name_of_def_file.field_2._M_local_buf + 0xf));
    if (bVar5) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_5a8,this_00);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::operator+(&local_5c8,"/",psVar9);
      std::__cxx11::string::operator+=((string *)local_5a8,(string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::operator+=((string *)local_5a8,".def ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e8,"LINK_FLAGS",&local_5e9);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_5e8);
      std::__cxx11::string::operator+=((string *)pmVar14," /DEF:");
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_630,pcVar12,&local_631);
      cmOutputConverter::ConvertToOutputFormat
                (&local_610,
                 &(pcVar17->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_630,SHELL);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_658,"LINK_FLAGS",&local_659);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_218,&local_658);
      std::__cxx11::string::operator+=((string *)pmVar14,(string *)&local_610);
      std::__cxx11::string::~string((string *)&local_658);
      std::allocator<char>::~allocator((allocator<char> *)&local_659);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator((allocator<char> *)&local_631);
      std::__cxx11::string::~string((string *)local_5a8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"JOB_POOL_LINK",&local_681);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&local_680,this_00,(cmNinjaVars *)local_218);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"LINK_FLAGS",&local_6a9);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_6a8);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,pmVar14);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"LINK_FLAGS",&local_6f1);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_6f0);
  cmGlobalNinjaGenerator::EncodeLiteral(&local_6d0,pmVar14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"LINK_FLAGS",&local_719);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_718);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  cmCommonTargetGenerator::GetManifests_abi_cxx11_(&local_740,(cmCommonTargetGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_760,"MANIFESTS",&local_761);
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_760);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string((string *)&local_740);
  std::operator+(&local_788,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&genTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7a8,"LINK_PATH",(allocator *)(t.field_2._M_local_buf + 0xf));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_7a8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)(t.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_788);
  if (targetType_00 == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7f0,"FLAGS",&local_7f1);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_7f0);
    std::__cxx11::string::string((string *)local_7d0,(string *)pmVar14);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)local_478,(string *)local_7d0,
               (cmGeneratorTarget *)createRule.field_2._8_8_,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_818,"FLAGS",(allocator *)(t_1.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_818);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_7d0);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator((allocator<char> *)(t_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_7d0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_860,"ARCH_FLAGS",&local_861);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_860);
    std::__cxx11::string::string((string *)local_840,(string *)pmVar14);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)local_478,(string *)local_840,
               (cmGeneratorTarget *)createRule.field_2._8_8_,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_888,"ARCH_FLAGS",&local_889);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_888);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_840);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
    std::__cxx11::string::operator=((string *)local_840,"");
    cmLocalGenerator::AddLanguageFlags
              ((cmLocalGenerator *)local_478,(string *)local_840,&this->TargetLinkLanguage,
               (string *)((long)&targetOutput.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8b0,"LANGUAGE_COMPILE_FLAGS",&local_8b1);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_8b0);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_840);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    std::__cxx11::string::~string((string *)local_840);
  }
  pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  bVar5 = cmGeneratorTarget::HasSOName(pcVar13,(string *)((long)&targetOutput.field_2 + 8));
  if (bVar5) {
    pcVar12 = cmMakefile::GetSONameFlag(this_01,&this->TargetLinkLanguage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8d8,"SONAME_FLAG",&local_8d9);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_8d8);
    std::__cxx11::string::operator=((string *)pmVar14,pcVar12);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_900,"SONAME",(allocator *)(install_dir.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_900);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&this->TargetNameSO);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator((allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    if (targetType_00 == SHARED_LIBRARY) {
      pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)local_928,pcVar13,(string *)((long)&targetOutput.field_2 + 8));
      uVar16 = std::__cxx11::string::empty();
      if ((uVar16 & 1) == 0) {
        cmOutputConverter::Convert
                  (&local_948,
                   &(local_478->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_928,NONE,SHELL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_968,"INSTALLNAME_DIR",
                   (allocator *)
                   ((long)&byproducts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_218,&local_968);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_948);
        std::__cxx11::string::~string((string *)&local_968);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&byproducts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_948);
      }
      std::__cxx11::string::~string((string *)local_928);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&impLibPath.field_2 + 8));
  uVar16 = std::__cxx11::string::empty();
  if ((uVar16 & 1) == 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_9a8,
               &(local_478->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_e8,SHELL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9c8,"TARGET_IMPLIB",(allocator *)(prefix.field_2._M_local_buf + 0xf)
              );
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_9c8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_9a8);
    bVar5 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)createRule.field_2._8_8_);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&impLibPath.field_2 + 8),(value_type *)local_e8);
    }
    std::__cxx11::string::~string((string *)local_9a8);
  }
  bVar5 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                    (&this->super_cmNinjaTargetGenerator,(cmNinjaVars *)local_218);
  if (!bVar5) {
    std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_a30);
    pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a50,"",(allocator *)(dbg_suffix.field_2._M_local_buf + 0xf));
    cmGeneratorTarget::GetFullNameComponents
              (pcVar13,(string *)((long)&base.field_2 + 8),(string *)((long)&suffix.field_2 + 8),
               (string *)local_a30,&local_a50,false);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator((allocator<char> *)(dbg_suffix.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a78,".dbg",&local_a79);
    std::allocator<char>::~allocator((allocator<char> *)&local_a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_aa0,"CMAKE_DEBUG_SYMBOL_SUFFIX",&local_aa1);
    pcVar12 = cmMakefile::GetDefinition(this_01,&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
    if (pcVar12 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ac8,"CMAKE_DEBUG_SYMBOL_SUFFIX",&local_ac9);
      pcVar12 = cmMakefile::GetDefinition(this_01,&local_ac8);
      std::__cxx11::string::operator=((string *)local_a78,pcVar12);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    }
    std::operator+(&local_b10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30);
    std::operator+(&local_af0,&local_b10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b30,"TARGET_PDB",(allocator *)(objPath.field_2._M_local_buf + 0xf));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_b30);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_af0);
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::~allocator((allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::~string((string *)local_a78);
    std::__cxx11::string::~string((string *)local_a30);
    std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  }
  pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_b58,pcVar13);
  pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&local_b98,&this->super_cmNinjaTargetGenerator,(string *)local_b58);
  cmOutputConverter::ConvertToOutputFormat
            (&local_b78,
             &(pcVar17->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_b98,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bb8,"OBJECT_DIR",(allocator *)((long)&linkLibraries + 7));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_bb8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibraries + 7));
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  cmNinjaTargetGenerator::EnsureDirectoryExists
            (&this->super_cmNinjaTargetGenerator,(string *)local_b58);
  pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar5 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar18);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_be8,"LINK_LIBRARIES",&local_be9);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator((allocator<char> *)&local_be9);
    local_bc8 = pmVar14;
    local_bf8._M_current = (char *)std::__cxx11::string::begin();
    local_c00 = (char *)std::__cxx11::string::end();
    link_path._7_1_ = 0x5c;
    link_path._6_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_bf8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_c00,(char *)((long)&link_path + 7),(char *)((long)&link_path + 6));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c30,"LINK_PATH",&local_c31);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_c30);
    std::__cxx11::string::~string((string *)&local_c30);
    std::allocator<char>::~allocator((allocator<char> *)&local_c31);
    local_c10 = pmVar14;
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    cmdLists[2]._7_1_ = 0x5c;
    cmdLists[2]._6_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,(char *)((long)cmdLists + 0x17),(char *)((long)cmdLists + 0x16));
  }
  cmGeneratorTarget::GetPreBuildCommands(this_00);
  cmdLists[0] = cmGeneratorTarget::GetPreLinkCommands(this_00);
  cmdLists[1] = cmGeneratorTarget::GetPostBuildCommands(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&postBuildCmdLines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c98);
  ppbStack_cb8 = &postBuildCmdLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmdLineLists[0] =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&postBuildCmdLines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmdLineLists[1] =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_c98;
  for (ci._M_current._4_4_ = 0; ci._M_current._4_4_ != 3;
      ci._M_current._4_4_ = ci._M_current._4_4_ + 1) {
    local_cc8._M_current =
         (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin
                   (cmdLists[(ulong)ci._M_current._4_4_ - 1]);
    while( true ) {
      ccg.Depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                              (cmdLists[(ulong)ci._M_current._4_4_ - 1]);
      bVar5 = __gnu_cxx::operator!=
                        (&local_cc8,
                         (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                          *)&ccg.Depends.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar5) break;
      cc = __gnu_cxx::
           __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
           ::operator*(&local_cc8);
      pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&ccByproducts,cc,
                 (string *)((long)&targetOutput.field_2 + 8),(cmLocalGenerator *)pcVar17);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (local_478,(cmCustomCommandGenerator *)&ccByproducts,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)(local_c98 + (ulong)ci._M_current._4_4_ * 8 + -0x20));
      local_d38 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&ccByproducts);
      local_d40._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_d38);
      local_d48._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_d38);
      local_d50 = std::
                  back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&impLibPath.field_2 + 8));
      local_d58 = (cmGlobalNinjaGenerator *)
                  cmNinjaTargetGenerator::MapToNinjaPath(&this->super_cmNinjaTargetGenerator);
      local_d60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                               (local_d40,local_d48,local_d50,(MapToNinjaPathImpl)local_d58);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&ccByproducts)
      ;
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
      ::operator++(&local_cc8);
    }
  }
  local_d82 = 0;
  local_d83 = 0;
  TVar8 = cmGeneratorTarget::GetType(this_00);
  local_1a15 = false;
  if (TVar8 == SHARED_LIBRARY) {
    pcVar15 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    local_d82 = 1;
    std::__cxx11::string::string
              ((string *)&local_d80,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS",&local_d81);
    local_d83 = 1;
    local_1a15 = cmMakefile::IsOn(pcVar15,&local_d80);
  }
  if ((local_d83 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d80);
  }
  if ((local_d82 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  }
  if (local_1a15 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_da8,"WINDOWS_EXPORT_ALL_SYMBOLS",
               (allocator *)(cmakeCommand.field_2._M_local_buf + 0xf));
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    if (bVar5) {
      pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)((long)&name_of_def_file_1.field_2 + 8),
                 &(pcVar17->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar9,SHELL);
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)local_df0,this_00);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cmd.field_2 + 8),"/",psVar9);
      std::__cxx11::string::operator+=((string *)local_df0,(string *)(cmd.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_df0,".def");
      std::__cxx11::string::string
                ((string *)local_e30,(string *)(name_of_def_file_1.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_e30," -E __create_def ");
      pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e70,pcVar12,
                 (allocator *)
                 ((long)&objs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmOutputConverter::ConvertToOutputFormat
                (&local_e50,
                 &(pcVar17->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_e70,SHELL);
      std::__cxx11::string::operator+=((string *)local_e30,(string *)&local_e50);
      std::__cxx11::string::~string((string *)&local_e50);
      std::__cxx11::string::~string((string *)&local_e70);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&objs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::operator+=((string *)local_e30," ");
      cmNinjaTargetGenerator::GetObjects_abi_cxx11_
                ((cmNinjaDeps *)((long)&obj_list_file.field_2 + 8),
                 &this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::string(local_eb0,(string *)local_df0);
      std::__cxx11::string::operator+=(local_eb0,".objs");
      pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ef0,pcVar12,(allocator *)&fout.field_0x247);
      cmOutputConverter::ConvertToOutputFormat
                (&local_ed0,
                 &(pcVar17->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_ef0,SHELL);
      std::__cxx11::string::operator+=((string *)local_e30,(string *)&local_ed0);
      std::__cxx11::string::~string((string *)&local_ed0);
      std::__cxx11::string::~string((string *)&local_ef0);
      std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&postBuildCmdLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_e30);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&i_1,pcVar12,false);
      local_1148._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&obj_list_file.field_2 + 8));
      while( true ) {
        homeOutDir.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&obj_list_file.field_2 + 8));
        bVar5 = __gnu_cxx::operator!=
                          (&local_1148,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&homeOutDir.field_2 + 8));
        if (!bVar5) break;
        pbVar19 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1148);
        bVar5 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(pbVar19,(char (*) [5])".obj");
        if (bVar5) {
          pbVar19 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1148);
          poVar11 = std::operator<<((ostream *)&i_1,(string *)pbVar19);
          std::operator<<(poVar11,"\n");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1148);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&i_1);
      std::__cxx11::string::~string(local_eb0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&obj_list_file.field_2 + 8));
      std::__cxx11::string::~string((string *)local_e30);
      std::__cxx11::string::~string((string *)local_df0);
      std::__cxx11::string::~string((string *)(name_of_def_file_1.field_2._M_local_buf + 8));
    }
  }
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&postBuildCmdLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar5) {
    pcVar4 = &local_478->super_cmLocalCommonGenerator;
    pcVar12 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)local_478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1190,pcVar12,&local_1191);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_1170,&(pcVar4->super_cmLocalGenerator).super_cmOutputConverter,
               &local_1190,SHELL);
    std::__cxx11::string::~string((string *)&local_1190);
    std::allocator<char>::~allocator((allocator<char> *)&local_1191);
    std::operator+(&local_11b8,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&postBuildCmdLines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_11b8);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::__cxx11::string::~string((string *)local_1170);
  }
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_11d8,local_478,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&postBuildCmdLines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11f8,"PRE_LINK",
             (allocator *)(postBuildCmdLine.field_2._M_local_buf + 0xf));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_11f8);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_11d8);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::allocator<char>::~allocator((allocator<char> *)(postBuildCmdLine.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_11d8);
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count,local_478,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_1250);
  _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8);
  if (_Var7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1270,"POST_BUILD",&local_1271);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_1270);
    std::__cxx11::string::operator=
              ((string *)pmVar14,
               (string *)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_1270);
    std::allocator<char>::~allocator((allocator<char> *)&local_1271);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1298,"POST_BUILD",&local_1299);
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_218,&local_1298);
    std::__cxx11::string::operator=((string *)pmVar14,":");
    std::__cxx11::string::~string((string *)&local_1298);
    std::allocator<char>::~allocator((allocator<char> *)&local_1299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_12c0,"POST_BUILD",(allocator *)((long)&globalGen + 7));
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1250,&local_12c0);
    std::__cxx11::string::operator=
              ((string *)pmVar14,
               (string *)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_12c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&globalGen + 7));
  }
  pcStack_12d0 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  forceRspFile._4_4_ = 1;
  local_12e0 = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1300,"CMAKE_NINJA_FORCE_RESPONSE_FILE",&local_1301);
  bVar6 = cmMakefile::IsDefinitionSet(this_01,&local_1300);
  bVar5 = false;
  if (!bVar6) {
    pcVar12 = cmsys::SystemTools::GetEnv(local_12e0);
    bVar5 = pcVar12 == (char *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_1300);
  std::allocator<char>::~allocator((allocator<char> *)&local_1301);
  pcVar18 = pcStack_12d0;
  if (bVar5) {
    LanguageLinkerRule_abi_cxx11_((string *)((long)&rspfile.field_2 + 8),this);
    linkRuleLength =
         cmGlobalNinjaGenerator::GetRuleCmdLength(pcVar18,(string *)((long)&rspfile.field_2 + 8));
    forceRspFile._4_4_ = calculateCommandLineLengthLimit(linkRuleLength);
    std::__cxx11::string::~string((string *)(rspfile.field_2._M_local_buf + 8));
  }
  pcVar12 = cmake::GetCMakeFilesDirectoryPostSlash();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1388,pcVar12,
             (allocator *)
             ((long)&orderOnlyDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
  std::operator+(&local_1368,&local_1388,psVar9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1348,
                 &local_1368,".rsp");
  std::__cxx11::string::~string((string *)&local_1368);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&orderOnlyDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_13a8);
  pcVar17 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetDepends(pcVar17,pcVar13,(cmNinjaDeps *)local_13a8);
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&impLibPath.field_2 + 8));
  pcVar12 = "i <= LZMA_FILTERS_MAX + 1";
  if (bVar5) {
    pcVar12 = "user=%s\x01auth=Bearer %s\x01\x01";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_13c8,"RESTAT",(allocator *)((long)&oi._M_current + 7));
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_218,&local_13c8);
  std::__cxx11::string::operator=((string *)pmVar14,pcVar12 + 0x18);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oi._M_current + 7));
  oe._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&impLibPath.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_13d8,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&oe);
  iStack_13f0 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&impLibPath.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_13e8,&stack0xffffffffffffec10);
  while (bVar5 = __gnu_cxx::operator!=(&local_13d8,&local_13e8), pcVar18 = pcStack_12d0, bVar5) {
    pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pbVar20 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_13d8);
    cmGlobalNinjaGenerator::SeenCustomCommandOutput(pcVar18,pbVar20);
    pbVar20 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_13d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&explicitDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar20);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_13d8);
  }
  local_13f1 = false;
  pcVar10 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::ostringstream::str();
  LanguageLinkerRule_abi_cxx11_(&local_1438,this);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar18,(ostream *)pcVar10,&local_1418,&local_1438,
             (cmNinjaDeps *)
             &explicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmNinjaDeps *)
             &implicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmNinjaDeps *)&mf,
             (cmNinjaDeps *)local_13a8,(cmNinjaVars *)local_218,(string *)local_1348,
             forceRspFile._4_4_,&local_13f1);
  std::__cxx11::string::~string((string *)&local_1438);
  std::__cxx11::string::~string((string *)&local_1418);
  WriteLinkRule(this,(bool)(local_13f1 & 1));
  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a8);
  if ((bVar5) &&
     (bVar5 = cmGeneratorTarget::IsFrameworkOnApple(this_00), pcVar18 = pcStack_12d0, !bVar5)) {
    if (targetType_00 == EXECUTABLE) {
      pcVar10 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_1458,"Create executable symlink ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1478,"CMAKE_SYMLINK_EXECUTABLE",&local_1479);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1499);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1498,1,(value_type *)local_58,&local_1499);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_14b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_14b8,1,(value_type *)local_a8,&local_14b9);
      ppbVar1 = &symlinks.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppbVar1);
      psVar2 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar18,(ostream *)pcVar10,&local_1458,&local_1478,&local_1498,&local_14b8,
                 (cmNinjaDeps *)psVar2,(cmNinjaDeps *)psVar2,(cmNinjaVars *)local_1250,
                 (string *)ppbVar1,-1,(bool *)0x0);
      std::__cxx11::string::~string
                ((string *)
                 &symlinks.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_14b8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_14b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1498);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1499);
      std::__cxx11::string::~string((string *)&local_1478);
      std::allocator<char>::~allocator((allocator<char> *)&local_1479);
      std::__cxx11::string::~string((string *)&local_1458);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&soName.field_2 + 8));
      cmNinjaTargetGenerator::GetTargetFilePath
                ((string *)local_1518,&this->super_cmNinjaTargetGenerator,&this->TargetNameSO);
      _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1518);
      if ((_Var7) ||
         (_Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1518), _Var7)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1538,"SONAME",&local_1539);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_1250,&local_1538);
        std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1518);
        std::__cxx11::string::~string((string *)&local_1538);
        std::allocator<char>::~allocator((allocator<char> *)&local_1539);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1560,"SONAME",&local_1561);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_1250,&local_1560);
        std::__cxx11::string::operator=((string *)pmVar14,"");
        std::__cxx11::string::~string((string *)&local_1560);
        std::allocator<char>::~allocator((allocator<char> *)&local_1561);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&soName.field_2 + 8),(value_type *)local_1518);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&soName.field_2 + 8),(value_type *)local_58);
      pcVar18 = pcStack_12d0;
      pcVar10 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_1588,"Create library symlink ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_15a8,"CMAKE_SYMLINK_LIBRARY",&local_15a9);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_15c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_15c8,1,(value_type *)local_a8,&local_15c9);
      std::__cxx11::string::string((string *)&local_15f0);
      psVar2 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar18,(ostream *)pcVar10,&local_1588,&local_15a8,
                 (cmNinjaDeps *)((long)&soName.field_2 + 8),&local_15c8,(cmNinjaDeps *)psVar2,
                 (cmNinjaDeps *)psVar2,(cmNinjaVars *)local_1250,&local_15f0,-1,(bool *)0x0);
      std::__cxx11::string::~string((string *)&local_15f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_15c8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_15c9);
      std::__cxx11::string::~string((string *)&local_15a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
      std::__cxx11::string::~string((string *)&local_1588);
      std::__cxx11::string::~string((string *)local_1518);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&soName.field_2 + 8));
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcStack_12d0,&this->TargetNameOut,this_00);
  pcVar18 = pcStack_12d0;
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1610,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar18,&local_1610,this_00);
  std::__cxx11::string::~string((string *)&local_1610);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_13a8);
  std::__cxx11::string::~string((string *)local_1348);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_1250);
  std::__cxx11::string::~string
            ((string *)&symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&postBuildCmdLines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_b58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&impLibPath.field_2 + 8));
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)&genTarget);
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&implicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&explicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(targetOutput.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(
                               gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
                                   gt.GetFullPath(cfgName,
                                      /*implib=*/false,
                                      /*realpath=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
                                     gt.GetFullPath(cfgName,
                                       /*implib=*/true));

  if (gt.IsAppBundleOnApple())
    {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNameOut, outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNameOut;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNameReal;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
    }
  else if (gt.IsFrameworkOnApple())
    {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNameOut,
                                              gt.GetDirectory(cfgName));
    }
  else if(gt.IsCFBundleOnApple())
    {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNameOut,
                                             gt.GetDirectory(cfgName));
    }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmState::TargetType targetType = gt.GetType();
  this->GetBuildFileStream()
    << "# Link build statements for "
    << cmState::GetTargetTypeName(targetType)
    << " target "
    << this->GetTargetName()
    << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment <<
    "Link the " << this->GetVisibleTypeName() << " " << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps();

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;
  cmGeneratorTarget& genTarget = *this->GetGeneratorTarget();

  std::string createRule =
    genTarget.GetCreateRuleVariable(this->TargetLinkLanguage,
                                    this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule+"_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmLocalGenerator::SHELL);

  localGen.GetTargetFlags(vars["LINK_LIBRARIES"],
                          vars["FLAGS"],
                          vars["LINK_FLAGS"],
                          frameworkPath,
                          linkPath,
                          &genTarget,
                          useWatcomQuote);
  if(this->GetMakefile()->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS")
     && gt.GetType() == cmState::SHARED_LIBRARY)
    {
    if(gt.GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS"))
      {
      std::string name_of_def_file
        = gt.GetSupportDirectory();
      name_of_def_file += "/" + gt.GetName();
      name_of_def_file += ".def ";
      vars["LINK_FLAGS"] += " /DEF:";
      vars["LINK_FLAGS"] += this->GetLocalGenerator()
        ->ConvertToOutputFormat(name_of_def_file.c_str(),
                                cmLocalGenerator::SHELL);
      }
    }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] = cmGlobalNinjaGenerator
                        ::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmState::EXECUTABLE)
    {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    vars["FLAGS"] = t;
    }
  else
    {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t = "";
    localGen.AddLanguageFlags(t, TargetLinkLanguage, cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
    }

  if (this->GetGeneratorTarget()->HasSOName(cfgName))
    {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNameSO;
    if (targetType == cmState::SHARED_LIBRARY)
      {
      std::string install_dir =
          this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty())
        {
        vars["INSTALLNAME_DIR"] = localGen.Convert(install_dir,
                                                   cmLocalGenerator::NONE,
                                                   cmLocalGenerator::SHELL);
        }
      }
    }

  cmNinjaDeps byproducts;

  if (!this->TargetNameImport.empty())
    {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
                                              targetOutputImplib,
                                              cmLocalGenerator::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if(genTarget.HasImportLibrary())
      {
      byproducts.push_back(targetOutputImplib);
      }
    }

  if (!this->SetMsvcTargetPdbVariable(vars))
    {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX"))
      {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
      }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
    }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(objPath), cmLocalGenerator::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows())
    {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
    }

  const std::vector<cmCustomCommand> *cmdLists[3] = {
    &gt.GetPreBuildCommands(),
    &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string> *cmdLineLists[3] = {
    &preLinkCmdLines,
    &preLinkCmdLines,
    &postBuildCmdLines
  };

  for (unsigned i = 0; i != 3; ++i)
    {
    for (std::vector<cmCustomCommand>::const_iterator
         ci = cmdLists[i]->begin();
         ci != cmdLists[i]->end(); ++ci)
      {
      cmCustomCommandGenerator ccg(*ci, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
      }
    }

  // maybe create .def file from list of objects
  if (gt.GetType() == cmState::SHARED_LIBRARY &&
      this->GetMakefile()->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS"))
    {
    if(gt.GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS"))
      {
      std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
      std::string name_of_def_file
        = gt.GetSupportDirectory();
      name_of_def_file += "/" + gt.GetName();
      name_of_def_file += ".def";
      std::string cmd = cmakeCommand;
      cmd += " -E __create_def ";
      cmd += this->GetLocalGenerator()
        ->ConvertToOutputFormat(name_of_def_file.c_str(),
                                cmLocalGenerator::SHELL);
      cmd += " ";
      cmNinjaDeps objs = this->GetObjects();
      std::string obj_list_file = name_of_def_file;
      obj_list_file += ".objs";
      cmd += this->GetLocalGenerator()
        ->ConvertToOutputFormat(obj_list_file.c_str(),
                                cmLocalGenerator::SHELL);
      preLinkCmdLines.push_back(cmd);
      // create a list of obj files for the -E __create_def to read
      cmGeneratedFileStream fout(obj_list_file.c_str());
      for(cmNinjaDeps::iterator i=objs.begin(); i != objs.end(); ++i)
        {
        if(cmHasLiteralSuffix(*i, ".obj"))
          {
          fout << *i << "\n";
          }
        }
      }
    }
  // If we have any PRE_LINK commands, we need to go back to HOME_OUTPUT for
  // the link commands.
  if (!preLinkCmdLines.empty())
    {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
                                            localGen.GetBinaryDirectory(),
                                            cmLocalGenerator::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
    }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines);
  std::string postBuildCmdLine = localGen.BuildCommandLine(postBuildCmdLines);

  cmNinjaVars symlinkVars;
  if (targetOutput == targetOutputReal)
    {
    vars["POST_BUILD"] = postBuildCmdLine;
    }
  else
    {
    vars["POST_BUILD"] = ":";
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
    }

  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  int commandLineLengthLimit = 1;
  const char* forceRspFile = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  if (!mf->IsDefinitionSet(forceRspFile) &&
      cmSystemTools::GetEnv(forceRspFile) == 0)
    {
    commandLineLengthLimit = calculateCommandLineLengthLimit(
                globalGen.GetRuleCmdLength(this->LanguageLinkerRule()));
    }

  const std::string rspfile =
      std::string(cmake::GetCMakeFilesDirectoryPostSlash())
      + gt.GetName() + ".rsp";

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
    orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty()? "" : "1";

  for (cmNinjaDeps::const_iterator oi = byproducts.begin(),
         oe = byproducts.end();
       oi != oe; ++oi)
    {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(*oi);
    outputs.push_back(*oi);
    }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(),
                        comment.str(),
                        this->LanguageLinkerRule(),
                        outputs,
                        explicitDeps,
                        implicitDeps,
                        orderOnlyDeps,
                        vars,
                        rspfile,
                        commandLineLengthLimit,
                        &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple())
    {
    if (targetType == cmState::EXECUTABLE)
      {
      globalGen.WriteBuild(this->GetBuildFileStream(),
                            "Create executable symlink " + targetOutput,
                            "CMAKE_SYMLINK_EXECUTABLE",
                            cmNinjaDeps(1, targetOutput),
                            cmNinjaDeps(1, targetOutputReal),
                            emptyDeps,
                            emptyDeps,
                            symlinkVars);
      }
   else
     {
      cmNinjaDeps symlinks;
      const std::string soName = this->GetTargetFilePath(this->TargetNameSO);
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName)
        {
        symlinkVars["SONAME"] = soName;
        }
      else
        {
        symlinkVars["SONAME"] = "";
        symlinks.push_back(soName);
        }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(this->GetBuildFileStream(),
                                  "Create library symlink " + targetOutput,
                                     "CMAKE_SYMLINK_LIBRARY",
                                  symlinks,
                                  cmNinjaDeps(1, targetOutputReal),
                                  emptyDeps,
                                  emptyDeps,
                                  symlinkVars);
      }
    }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNameOut, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}